

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Show(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_40;
  uint local_3c;
  int fPath;
  int fFadds;
  int fAdders;
  int c;
  Vec_Int_t *vBold;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _fAdders = (Vec_Int_t *)0x0;
  fPath = 0;
  local_3c = 0;
  local_40 = 0;
  vBold = (Vec_Int_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
LAB_0029ff37:
  iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)vBold,"afph");
  if (iVar1 == -1) {
    if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Show(): There is no AIG.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Gia_ManBufNum(pAStack_18->pGia);
      if (iVar1 == 0) {
        if ((fPath == 0) && (iVar1 = Gia_ManHasMapping(pAStack_18->pGia), iVar1 != 0)) {
          _fAdders = Vec_IntAlloc(100);
          for (fFadds = 1; iVar1 = Gia_ManObjNum(pAStack_18->pGia), fFadds < iVar1;
              fFadds = fFadds + 1) {
            iVar1 = Gia_ObjIsLut(pAStack_18->pGia,fFadds);
            if (iVar1 != 0) {
              Vec_IntPush(_fAdders,fFadds);
            }
          }
        }
        Gia_ManShow(pAStack_18->pGia,_fAdders,fPath,local_3c,local_40);
        Vec_IntFreeP((Vec_Int_t **)&fAdders);
        pAbc_local._4_4_ = 0;
      }
      else {
        Abc_Print(-1,"Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n");
        pAbc_local._4_4_ = 1;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x61:
    fPath = fPath ^ 1;
    goto LAB_0029ff37;
  default:
    break;
  case 0x66:
    local_3c = local_3c ^ 1;
    goto LAB_0029ff37;
  case 0x68:
    break;
  case 0x70:
    goto switchD_0029ff75_caseD_70;
  }
  Abc_Print(-2,"usage: &show [-afph]\n");
  Abc_Print(-2,"\t        shows the current GIA using GSView\n");
  pcVar2 = "no";
  if (fPath != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-a    : toggle visualazing adders [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_3c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-f    : toggle showing only full-adders with \"-a\" [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_40 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-p    : toggle showing the critical path of a LUT mapping [default = %s]\n",pcVar2
           );
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
switchD_0029ff75_caseD_70:
  local_40 = local_40 ^ 1;
  goto LAB_0029ff37;
}

Assistant:

int Abc_CommandAbc9Show( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Int_t * vBold = NULL;
    int c, fAdders = 0, fFadds = 0, fPath = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "afph" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAdders ^= 1;
            break;
        case 'f':
            fFadds ^= 1;
            break;
        case 'p':
            fPath ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n" );
        return 1;
    }
    if ( !fAdders && Gia_ManHasMapping(pAbc->pGia) )
    {
        vBold = Vec_IntAlloc( 100 );
        Gia_ManForEachLut( pAbc->pGia, c )
            Vec_IntPush( vBold, c );
    }
    Gia_ManShow( pAbc->pGia, vBold, fAdders, fFadds, fPath );
    Vec_IntFreeP( &vBold );
    return 0;

usage:
    Abc_Print( -2, "usage: &show [-afph]\n" );
    Abc_Print( -2, "\t        shows the current GIA using GSView\n" );
    Abc_Print( -2, "\t-a    : toggle visualazing adders [default = %s]\n", fAdders? "yes": "no" );
    Abc_Print( -2, "\t-f    : toggle showing only full-adders with \"-a\" [default = %s]\n", fFadds? "yes": "no" );
    Abc_Print( -2, "\t-p    : toggle showing the critical path of a LUT mapping [default = %s]\n", fPath? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}